

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool peparse::readCString(bounded_buffer *buffer,uint32_t off,string *result)

{
  uchar *__beg;
  uchar *__end;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint8_t *x;
  uint8_t *b;
  uint32_t n;
  uint8_t *p;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uchar *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  const_iterator __p;
  bool local_1;
  
  if (in_ESI < *(uint *)(in_RDI + 1)) {
    __p._M_current = (char *)*in_RDI;
    uVar1 = *(uint *)(in_RDI + 1);
    __beg = (uchar *)(__p._M_current + in_ESI);
    __end = std::find<unsigned_char*,int>
                      (in_stack_ffffffffffffffc0,(uchar *)(ulong)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0);
    if (__end == (uchar *)(__p._M_current + uVar1)) {
      local_1 = false;
    }
    else {
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                (in_stack_ffffffffffffffa0,in_RDX);
      std::__cxx11::string::insert<unsigned_char*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,in_stack_ffffffffffffffd0),__p,__beg,__end);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool readCString(const bounded_buffer &buffer,
                        std::uint32_t off,
                        std::string &result) {
  if (off < buffer.bufLen) {
    std::uint8_t *p = buffer.buf;
    std::uint32_t n = buffer.bufLen;
    std::uint8_t *b = p + off;
    std::uint8_t *x = std::find(b, p + n, 0);

    if (x == p + n) {
      return false;
    }

    result.insert(result.end(), b, x);
    return true;
  }
  return false;
}